

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O0

void __thiscall disruptor::RingBuffer<long,_0>::RingBuffer(RingBuffer<long,_0> *this,size_t n)

{
  runtime_error *this_00;
  vector<long,_std::allocator<long>_> *in_RSI;
  int *in_RDI;
  size_type in_stack_ffffffffffffffe8;
  
  *in_RDI = (int)in_RSI + -1;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x15d791);
  if ((in_RSI != (vector<long,_std::allocator<long>_> *)0x0) &&
     ((vector<long,_std::allocator<long>_> *)
      ((ulong)in_RSI & ((ulong)in_RSI ^ 0xffffffffffffffff) + 1) == in_RSI)) {
    std::vector<long,_std::allocator<long>_>::resize(in_RSI,in_stack_ffffffffffffffe8);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"RingBuffer<T, 0>\'s size must be a positive power of 2");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RingBuffer(size_t n = kDefaultRingBufferSize) : index_mask_(n - 1) {
    if (((n == 0) || ((n & (~n + 1)) != n))) {
      throw std::runtime_error(
          "RingBuffer<T, 0>'s size must be a positive power of 2");
    }

    events_.resize(n);
  }